

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

ssize_t __thiscall PosixRunWriter::write(PosixRunWriter *this,int __fd,void *__buf,size_t __n)

{
  ulong extraout_RAX;
  ulong uVar1;
  byte local_2a;
  byte local_29;
  
  for (uVar1 = ~this->prev_ + (ulong)(uint)__fd; this->out_bytes_ = this->out_bytes_ + 1,
      local_29 = (byte)uVar1, 0x7f < (long)uVar1; uVar1 = uVar1 >> 7) {
    local_2a = local_29 | 0x80;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->buffer_,&local_2a);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->buffer_,&local_29);
  this->prev_ = (ulong)(uint)__fd;
  uVar1 = (long)(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (0x8000000 < uVar1) {
    flush(this);
    uVar1 = extraout_RAX;
  }
  return uVar1;
}

Assistant:

void PosixRunWriter::write(FileId next) {
    assert(next > prev_);
    int64_t diff = (next - prev_) - 1;
    while (diff >= 0x80U) {
        out_bytes_++;
        buffer_.push_back(static_cast<uint8_t>(0x80U | (diff & 0x7FU)));
        diff >>= 7;
    }
    out_bytes_++;
    buffer_.push_back(static_cast<uint8_t>(diff));
    prev_ = next;

    if (buffer_.size() > RUN_BUFFER_SIZE) {
        flush();
    }
}